

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

BSDFSample * __thiscall
pbrt::DielectricInterfaceBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,DielectricInterfaceBxDF *this,Vector3f wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  TrowbridgeReitzDistribution *this_00;
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int iVar11;
  long in_FS_OFFSET;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Float FVar21;
  Float FVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float cd;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  Vector3f VVar45;
  Tuple3<pbrt::Vector3,_float> local_118;
  float local_10c;
  Tuple3<pbrt::Vector3,_float> local_108;
  Vector3f local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float local_b4;
  Float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar28._4_60_ = wo._12_60_;
  auVar28._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._8_56_ = wo._8_56_;
  auVar25._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16 = auVar25._0_16_;
  local_f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar16);
  if ((auVar28._0_4_ != 0.0) || (NAN(auVar28._0_4_))) {
    auVar24 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                         ZEXT416((uint)(this->mfDistrib).alpha_x));
    local_f8.super_Tuple3<pbrt::Vector3,_float>.z = auVar28._0_4_;
    if (0.001 <= auVar24._0_4_) {
      this_00 = &this->mfDistrib;
      local_d8._0_4_ = uc;
      VVar45 = TrowbridgeReitzDistribution::Sample_wm(this_00,&local_f8,u);
      auVar29._4_60_ = auVar28._4_60_;
      auVar29._0_4_ = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar26._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar26._8_56_ = auVar25._8_56_;
      auVar35._8_8_ = 0;
      auVar35._0_4_ = local_f8.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar35._4_4_ = local_f8.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar23 = auVar26._0_16_;
      auVar16 = vmovshdup_avx(auVar23);
      auVar43 = ZEXT816(0) << 0x40;
      local_108._0_8_ = vmovlps_avx(auVar23);
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * 0.0)),auVar23,auVar43);
      auVar24 = vmovshdup_avx(auVar35);
      fVar13 = auVar14._0_4_ + auVar29._0_4_;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * auVar16._0_4_)),auVar35,auVar23);
      auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.z)
                                ,auVar29._0_16_);
      fVar12 = auVar14._0_4_ + auVar14._0_4_;
      auVar14._0_4_ = VVar45.super_Tuple3<pbrt::Vector3,_float>.x * fVar12;
      auVar14._4_4_ = VVar45.super_Tuple3<pbrt::Vector3,_float>.y * fVar12;
      fVar31 = auVar25._8_4_;
      auVar14._8_4_ = fVar31 * fVar12;
      fVar30 = auVar25._12_4_;
      auVar14._12_4_ = fVar30 * fVar12;
      local_118.z = auVar29._0_4_ * fVar12 - local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar14 = vsubps_avx(auVar14,auVar35);
      auVar18 = auVar23;
      if (fVar13 < 0.0) {
        auVar18._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
        auVar18._8_4_ = -fVar31;
        auVar18._12_4_ = -fVar30;
      }
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar13),auVar43,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      auVar17._4_12_ = auVar28._4_12_;
      auVar17._0_4_ = (uint)bVar3 * (int)-auVar29._0_4_ + (uint)!bVar3 * (int)auVar29._0_4_;
      auVar40._0_4_ = auVar18._0_4_ * auVar14._0_4_;
      auVar40._4_4_ = auVar18._4_4_ * auVar14._4_4_;
      auVar40._8_4_ = auVar18._8_4_ * auVar14._8_4_;
      auVar40._12_4_ = auVar18._12_4_ * auVar14._12_4_;
      auVar19 = vmovshdup_avx(auVar40);
      auVar18 = vfmadd231ss_fma(auVar19,auVar14,auVar18);
      auVar19 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_118.z),auVar17);
      fVar13 = this->eta;
      local_c8 = SUB6416(ZEXT464(0x3f800000),0);
      auVar18 = vminss_avx(local_c8,auVar19);
      uVar2 = vcmpss_avx512f(local_c8,auVar19,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      bVar8 = auVar19._0_4_ < -1.0;
      fVar12 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar18._0_4_);
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(auVar19,auVar20);
      bVar9 = 0.0 < fVar12;
      auVar19._4_12_ = auVar18._4_12_;
      auVar19._0_4_ =
           (uint)bVar9 * (int)fVar12 +
           (uint)!bVar9 *
           ((uint)bVar8 * 0x3f800000 +
           (uint)!bVar8 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar18._0_4_));
      fVar12 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)(1.0 / fVar13));
      auVar20 = ZEXT416((uint)fVar12);
      auVar18 = vfnmadd213ss_fma(auVar19,auVar19,local_c8);
      auVar18 = vmaxss_avx(auVar18,auVar43);
      auVar18 = vsqrtss_avx(auVar18,auVar18);
      auVar43._0_4_ = auVar18._0_4_ / fVar12;
      auVar43._4_12_ = auVar18._4_12_;
      if (auVar43._0_4_ < 1.0) {
        auVar18 = vfnmadd213ss_fma(auVar43,auVar43,ZEXT416(0x3f800000));
        auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x20);
        auVar18 = vsqrtss_avx(auVar18,auVar18);
        auVar17 = vfmsub213ss_fma(auVar19,auVar20,auVar18);
        auVar43 = vfmadd213ss_fma(auVar19,auVar20,auVar18);
        auVar44._0_4_ = auVar17._0_4_ / auVar43._0_4_;
        auVar44._4_12_ = auVar17._4_12_;
        auVar43 = vfnmadd213ss_fma(auVar18,auVar20,auVar19);
        auVar18 = vfmadd213ss_fma(auVar18,auVar20,auVar19);
        fVar12 = auVar43._0_4_ / auVar18._0_4_;
        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar44,auVar44);
        local_c8 = ZEXT416((uint)(auVar18._0_4_ * 0.5));
      }
      fVar12 = 1.0 - local_c8._0_4_;
      local_e8._0_4_ = (uint)((byte)sampleFlags & 1) * (int)local_c8._0_4_;
      local_e8._4_12_ = local_c8._4_12_;
      local_98 = ZEXT416((uint)fVar12);
      fVar12 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar12);
      local_88 = ZEXT416((uint)fVar12);
      if ((((float)local_e8._0_4_ != 0.0) || (fVar12 != 0.0)) || (NAN(fVar12))) {
        fVar12 = (float)local_e8._0_4_ + fVar12;
        local_108.z = auVar29._0_4_;
        if ((float)local_e8._0_4_ / fVar12 <= (float)local_d8._0_4_) {
          auVar14 = ZEXT816(0) << 0x20;
          local_118.x = 0.0;
          local_118.y = 0.0;
          local_118.z = 0.0;
          uVar2 = vcmpss_avx512f(auVar14,ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.z
                                                ),1);
          bVar3 = (bool)((byte)uVar2 & 1);
          auVar16 = vfmadd213ss_fma(auVar24,auVar16,
                                    ZEXT416((uint)(auVar29._0_4_ *
                                                  local_f8.super_Tuple3<pbrt::Vector3,_float>.z)));
          auVar24 = vfmsub231ss_fma(ZEXT416((uint)(auVar29._0_4_ *
                                                  local_f8.super_Tuple3<pbrt::Vector3,_float>.z)),
                                    auVar29._0_16_,
                                    ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.z));
          fVar13 = (float)((uint)bVar3 * (int)fVar13 + (uint)!bVar3 * (int)(1.0 / fVar13));
          local_d8 = ZEXT416((uint)fVar13);
          auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ + auVar16._0_4_)),auVar23,auVar35);
          auVar16 = vfnmadd213ss_fma(auVar24,auVar24,SUB6416(ZEXT464(0x3f800000),0));
          auVar16 = vmaxss_avx(auVar16,auVar14);
          local_e8._0_4_ = auVar16._0_4_ / (fVar13 * fVar13);
          if ((float)local_e8._0_4_ < 1.0) {
            auVar16 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_e8._0_4_)),auVar14);
            auVar14 = vsqrtss_avx(auVar16,auVar16);
            auVar16._4_4_ = fVar13;
            auVar16._0_4_ = fVar13;
            auVar16._8_4_ = fVar13;
            auVar16._12_4_ = fVar13;
            auVar16 = vdivps_avx(auVar35,auVar16);
            fVar1 = auVar24._0_4_ / fVar13 - auVar14._0_4_;
            auVar24._0_4_ = VVar45.super_Tuple3<pbrt::Vector3,_float>.x * fVar1;
            auVar24._4_4_ = VVar45.super_Tuple3<pbrt::Vector3,_float>.y * fVar1;
            auVar24._8_4_ = fVar31 * fVar1;
            auVar24._12_4_ = fVar30 * fVar1;
            local_118.z = auVar29._0_4_ * fVar1 -
                          local_f8.super_Tuple3<pbrt::Vector3,_float>.z / fVar13;
            auVar16 = vsubps_avx(auVar24,auVar16);
            local_118._0_8_ = vmovlps_avx(auVar16);
          }
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar11 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                            ::reg), iVar11 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#3}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(in_FS_OFFSET + -0xb0) = *(long *)(in_FS_OFFSET + -0xb0) + 1;
          if (1.0 <= (float)local_e8._0_4_) {
            *(long *)(in_FS_OFFSET + -0xb8) = *(long *)(in_FS_OFFSET + -0xb8) + 1;
          }
          if ((local_f8.super_Tuple3<pbrt::Vector3,_float>.z * local_118.z <= 0.0) &&
             ((float)local_e8._0_4_ < 1.0)) {
            auVar23._0_12_ = ZEXT812(0);
            auVar23._12_4_ = 0;
            if ((local_118.z != 0.0) || (NAN(local_118.z))) {
              local_58._8_8_ = 0;
              local_58._0_4_ = local_108.x;
              local_58._4_4_ = local_108.y;
              local_10c = local_118.z;
              local_c8._0_4_ = local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar16 = vmovshdup_avx(local_58);
              auVar16 = vfmadd213ss_fma(auVar16,auVar23,ZEXT416((uint)local_108.z));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ + (local_108.z - local_108.z)))
                                        ,local_58,auVar23);
              if (auVar16._0_4_ < 0.0) {
                local_58._0_8_ = local_108._0_8_ ^ 0x8000000080000000;
                local_58._8_4_ = 0x80000000;
                local_58._12_4_ = 0x80000000;
              }
              uVar2 = vcmpss_avx512f(auVar16,auVar23,1);
              bVar3 = (bool)((byte)uVar2 & 1);
              local_108._0_8_ = vmovlps_avx(local_58);
              local_108.z = (float)((uint)bVar3 * (int)-local_108.z +
                                   (uint)!bVar3 * (int)local_108.z);
              local_48 = ZEXT416((uint)local_108.z);
              local_9c = local_f8.super_Tuple3<pbrt::Vector3,_float>.x;
              local_a0 = local_f8.super_Tuple3<pbrt::Vector3,_float>.y;
              local_a4 = local_118.x;
              local_a8 = local_118.y;
              local_b0 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_108);
              local_b8 = TrowbridgeReitzDistribution::G(this_00,&local_f8,(Vector3f *)&local_118);
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_108.y * local_118.y)),
                                        ZEXT416((uint)local_108.x),ZEXT416((uint)local_118.x));
              auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_108.y *
                                                      local_f8.super_Tuple3<pbrt::Vector3,_float>.y)
                                               ),ZEXT416((uint)local_108.x),
                                        ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.x)
                                       );
              local_ac = local_118.z;
              local_b4 = local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_118.z),
                                        ZEXT416((uint)local_108.z));
              auVar7._8_4_ = 0x7fffffff;
              auVar7._0_8_ = 0x7fffffff7fffffff;
              auVar7._12_4_ = 0x7fffffff;
              local_78 = vandps_avx512vl(auVar16,auVar7);
              local_68 = vfmadd231ss_fma(auVar24,ZEXT416((uint)local_f8.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                         ZEXT416((uint)local_108.z));
              auVar16 = vfmadd132ss_fma(auVar16,local_68,ZEXT416((uint)local_d8._0_4_));
              local_e8._0_4_ = local_78._0_4_ / (auVar16._0_4_ * auVar16._0_4_);
              FVar21 = TrowbridgeReitzDistribution::PDF(this_00,&local_f8,(Vector3f *)&local_108);
              fVar12 = (FVar21 * (float)local_e8._0_4_ * (float)local_88._0_4_) / fVar12;
              if (!NAN(fVar12)) {
                auVar38._8_4_ = 0x7fffffff;
                auVar38._0_8_ = 0x7fffffff7fffffff;
                auVar38._12_4_ = 0x7fffffff;
                auVar16 = vandps_avx(auVar38,local_68);
                fVar13 = 1.0 / local_d8._0_4_;
                auVar24 = vmovshdup_avx(local_58);
                auVar14 = vfmadd213ss_fma(ZEXT416((uint)local_a4),local_58,
                                          ZEXT416((uint)(auVar24._0_4_ * local_a8)));
                auVar24 = vfmadd213ss_fma(ZEXT416((uint)local_9c),local_58,
                                          ZEXT416((uint)(auVar24._0_4_ * local_a0)));
                auVar14 = vfmadd213ss_fma(ZEXT416((uint)local_10c),local_48,auVar14);
                auVar24 = vfmadd213ss_fma(ZEXT416((uint)local_c8._0_4_),local_48,auVar24);
                auVar14 = vfmadd231ss_fma(auVar24,local_d8,auVar14);
                auVar24 = vandps_avx(ZEXT416((uint)(local_b4 * local_ac)),auVar38);
                auVar33._0_4_ =
                     (local_b8 * local_b0 * (float)local_78._0_4_ * auVar16._0_4_) /
                     (auVar14._0_4_ * auVar14._0_4_ * auVar24._0_4_);
                auVar33._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar16 = vandps_avx(auVar33,auVar38);
                fVar13 = (float)((uint)(mode == Radiance) * (int)(fVar13 * fVar13) +
                                (uint)(mode != Radiance) * 0x3f800000) * (float)local_98._0_4_ *
                         auVar16._0_4_;
                (__return_storage_ptr__->f).values.values[0] = fVar13;
                (__return_storage_ptr__->f).values.values[1] = fVar13;
                (__return_storage_ptr__->f).values.values[2] = fVar13;
                (__return_storage_ptr__->f).values.values[3] = fVar13;
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_118.x;
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_118.y;
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_118.z;
                __return_storage_ptr__->pdf = fVar12;
                __return_storage_ptr__->flags = GlossyTransmission;
                return __return_storage_ptr__;
              }
              LogFatal<char_const(&)[12]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
                         ,0x17a,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
            }
          }
        }
        else {
          local_118._0_8_ = vmovlps_avx(auVar14);
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar11 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                            ::reg), iVar11 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(in_FS_OFFSET + -0xc0) = *(long *)(in_FS_OFFSET + -0xc0) + 1;
          auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_f8.super_Tuple3<pbrt::Vector3,_float>.y *
                                                  local_108.y)),
                                    ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.x),
                                    ZEXT416((uint)local_108.x));
          auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_f8.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_108.z));
          if (auVar16._0_4_ <= 0.0) {
            *(long *)(in_FS_OFFSET + -200) = *(long *)(in_FS_OFFSET + -200) + 1;
          }
          else if (0.0 < local_f8.super_Tuple3<pbrt::Vector3,_float>.z * local_118.z) {
            local_d8 = ZEXT416((uint)local_118.z);
            FVar21 = TrowbridgeReitzDistribution::PDF(this_00,&local_f8,(Vector3f *)&local_108);
            auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_f8.super_Tuple3<pbrt::Vector3,_float>.y *
                                                    local_108.y)),
                                      ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.x),
                                      ZEXT416((uint)local_108.x));
            auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_f8.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                      ZEXT416((uint)local_108.z));
            fVar12 = ((FVar21 / (auVar16._0_4_ * 4.0)) * (float)local_e8._0_4_) / fVar12;
            if (NAN(fVar12)) {
              LogFatal<char_const(&)[12]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
                         ,0x150,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
            }
            if (((local_f8.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
                (NAN(local_f8.super_Tuple3<pbrt::Vector3,_float>.z))) &&
               (((float)local_d8._0_4_ != 0.0 || (NAN((float)local_d8._0_4_))))) {
              local_e8._0_4_ = fVar12;
              local_98 = ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.z);
              FVar21 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_108);
              FVar22 = TrowbridgeReitzDistribution::G(this_00,&local_f8,(Vector3f *)&local_118);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar16 = vandps_avx(auVar27,local_98);
              auVar24 = vandps_avx(auVar27,local_d8);
              fVar13 = (FVar22 * FVar21 * (float)local_c8._0_4_) /
                       (auVar16._0_4_ * auVar24._0_4_ * 4.0);
              (__return_storage_ptr__->f).values.values[0] = fVar13;
              (__return_storage_ptr__->f).values.values[1] = fVar13;
              (__return_storage_ptr__->f).values.values[2] = fVar13;
              (__return_storage_ptr__->f).values.values[3] = fVar13;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_118.x;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_118.y;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_118.z;
              __return_storage_ptr__->pdf = (Float)local_e8._0_4_;
              __return_storage_ptr__->flags = GlossyReflection;
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
    else {
      fVar13 = this->eta;
      auVar23 = auVar28._0_16_;
      auVar35 = SUB6416(ZEXT464(0x3f800000),0);
      auVar24 = vminss_avx(auVar35,auVar23);
      uVar2 = vcmpss_avx512f(auVar35,auVar23,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      bVar8 = auVar28._0_4_ < -1.0;
      fVar12 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar24._0_4_);
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx512vl(auVar23,auVar4);
      bVar9 = 0.0 < fVar12;
      auVar15._4_12_ = auVar14._4_12_;
      auVar15._0_4_ =
           (uint)bVar9 * (int)fVar12 +
           (uint)!bVar9 *
           ((uint)bVar8 * 0x3f800000 +
           (uint)!bVar8 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * (int)auVar14._0_4_));
      fVar12 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)(1.0 / fVar13));
      auVar18 = ZEXT416((uint)fVar12);
      auVar24 = vfnmadd213ss_fma(auVar15,auVar15,auVar35);
      auVar24 = vmaxss_avx(auVar24,ZEXT816(0) << 0x40);
      auVar24 = vsqrtss_avx(auVar24,auVar24);
      auVar41._0_4_ = auVar24._0_4_ / fVar12;
      auVar41._4_12_ = auVar24._4_12_;
      if (auVar41._0_4_ < 1.0) {
        auVar24 = vfnmadd213ss_fma(auVar41,auVar41,ZEXT416(0x3f800000));
        auVar24 = vmaxss_avx(auVar24,ZEXT816(0) << 0x40);
        auVar24 = vsqrtss_avx(auVar24,auVar24);
        auVar43 = vfmsub213ss_fma(auVar15,auVar18,auVar24);
        auVar35 = vfmadd213ss_fma(auVar15,auVar18,auVar24);
        auVar42._0_4_ = auVar43._0_4_ / auVar35._0_4_;
        auVar42._4_12_ = auVar43._4_12_;
        auVar35 = vfnmadd213ss_fma(auVar24,auVar18,auVar15);
        auVar24 = vfmadd213ss_fma(auVar24,auVar18,auVar15);
        fVar12 = auVar35._0_4_ / auVar24._0_4_;
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar42,auVar42);
        auVar35 = ZEXT416((uint)(auVar24._0_4_ * 0.5));
      }
      fVar30 = auVar35._0_4_;
      fVar12 = (float)((uint)((byte)sampleFlags & 1) * (int)fVar30);
      local_e8 = ZEXT416((uint)(1.0 - fVar30));
      fVar31 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - fVar30));
      local_d8 = ZEXT416((uint)fVar31);
      if (((fVar12 != 0.0) || (fVar31 != 0.0)) || (NAN(fVar31))) {
        local_98._0_4_ = fVar31 + fVar12;
        fVar12 = fVar12 / (fVar31 + fVar12);
        if (uc < fVar12) {
          fVar30 = fVar30 / auVar14._0_4_;
          auVar5._8_4_ = 0x80000000;
          auVar5._0_8_ = 0x8000000080000000;
          auVar5._12_4_ = 0x80000000;
          auVar16 = vxorps_avx512vl(auVar16,auVar5);
          (__return_storage_ptr__->f).values.values[0] = fVar30;
          (__return_storage_ptr__->f).values.values[1] = fVar30;
          (__return_storage_ptr__->f).values.values[2] = fVar30;
          (__return_storage_ptr__->f).values.values[3] = fVar30;
          uVar2 = vmovlps_avx(auVar16);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)uVar2 >> 0x20);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = auVar28._0_4_;
          __return_storage_ptr__->pdf = fVar12;
          __return_storage_ptr__->flags = SpecularReflection;
          return __return_storage_ptr__;
        }
        auVar32._0_12_ = ZEXT412(0);
        auVar32._12_4_ = 0;
        auVar24 = vmovshdup_avx(auVar16);
        uVar2 = vcmpss_avx512f(auVar32,auVar23,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar13 = (float)((uint)bVar3 * (int)fVar13 + (uint)!bVar3 * (int)(1.0 / fVar13));
        auVar36._0_12_ = ZEXT812(0);
        auVar36._12_4_ = 0;
        auVar14 = vfmadd213ss_fma(auVar36,auVar24,auVar23);
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)((auVar28._0_4_ - auVar28._0_4_) + auVar14._0_4_)),
                                  auVar16,auVar32);
        auVar10._12_4_ = 0;
        auVar10._0_12_ = ZEXT812(0);
        local_88 = auVar10 << 0x20;
        if (auVar14._0_4_ < 0.0) {
          auVar37._8_4_ = 0x80000000;
          auVar37._0_8_ = 0x8000000080000000;
          auVar37._12_4_ = 0x80000000;
        }
        else {
          auVar37 = ZEXT816(0) << 0x20;
        }
        auVar18 = vmovshdup_avx(auVar37);
        local_c8 = ZEXT816(0) << 0x20;
        uVar2 = vcmpss_avx512f(auVar14,ZEXT416(0) << 0x20,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        local_10c = fVar13 * fVar13;
        fVar12 = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * 0x3f800000);
        auVar24 = vfmadd213ss_fma(auVar24,auVar18,ZEXT416((uint)(fVar12 * auVar28._0_4_)));
        auVar14 = vfmsub231ss_fma(ZEXT416((uint)(fVar12 * auVar28._0_4_)),ZEXT416((uint)fVar12),
                                  auVar23);
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ + auVar24._0_4_)),auVar37,auVar16);
        auVar24 = vfnmadd213ss_fma(auVar14,auVar14,SUB6416(ZEXT464(0x3f800000),0));
        auVar24 = vmaxss_avx(auVar24,ZEXT416(0) << 0x20);
        fVar31 = auVar24._0_4_ / local_10c;
        if (fVar31 < 1.0) {
          auVar34._4_4_ = fVar13;
          auVar34._0_4_ = fVar13;
          auVar34._8_4_ = fVar13;
          auVar34._12_4_ = fVar13;
          auVar24 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar31)),ZEXT816(0) << 0x20);
          auVar24 = vsqrtss_avx(auVar24,auVar24);
          auVar16 = vdivps_avx(auVar16,auVar34);
          fVar30 = auVar14._0_4_ / fVar13 - auVar24._0_4_;
          auVar39._0_4_ = auVar37._0_4_ * fVar30;
          auVar39._4_4_ = auVar37._4_4_ * fVar30;
          auVar39._8_4_ = auVar37._8_4_ * fVar30;
          auVar39._12_4_ = auVar37._12_4_ * fVar30;
          local_88 = vsubps_avx(auVar39,auVar16);
          local_c8 = ZEXT416((uint)(fVar12 * fVar30 - auVar28._0_4_ / fVar13));
        }
        if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar11 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                          ::reg), iVar11 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
        *(long *)(in_FS_OFFSET + -0xd0) = *(long *)(in_FS_OFFSET + -0xd0) + 1;
        if (fVar31 < 1.0) {
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar16 = vandps_avx512vl(local_c8,auVar6);
          local_e8._0_4_ = (float)local_e8._0_4_ / auVar16._0_4_;
          if (mode == Radiance) {
            local_e8._0_4_ = (float)local_e8._0_4_ / local_10c;
          }
          (__return_storage_ptr__->f).values.values[0] = (float)local_e8._0_4_;
          (__return_storage_ptr__->f).values.values[1] = (float)local_e8._0_4_;
          (__return_storage_ptr__->f).values.values[2] = (float)local_e8._0_4_;
          (__return_storage_ptr__->f).values.values[3] = (float)local_e8._0_4_;
          uVar2 = vmovlps_avx(local_88);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)uVar2 >> 0x20);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_c8._0_4_;
          __return_storage_ptr__->pdf = (float)local_d8._0_4_ / (float)local_98._0_4_;
          __return_storage_ptr__->flags = SpecularTransmission;
          return __return_storage_ptr__;
        }
        *(long *)(in_FS_OFFSET + -0xd8) = *(long *)(in_FS_OFFSET + -0xd8) + 1;
      }
    }
  }
  __return_storage_ptr__->flags = Unset;
  (__return_storage_ptr__->f).values.values[0] = 0.0;
  (__return_storage_ptr__->f).values.values[1] = 0.0;
  (__return_storage_ptr__->f).values.values[2] = 0.0;
  (__return_storage_ptr__->f).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        if (wo.z == 0)
            return {};

        if (mfDistrib.EffectivelySpecular()) {
            // Sample delta dielectric interface
            Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample perfect specular reflection at interface
                Vector3f wi(-wo.x, -wo.y, wo.z);
                SampledSpectrum fr(R / AbsCosTheta(wi));
                return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

            } else {
                // Sample perfect specular transmission at interface
                // Figure out which $\eta$ is incident and which is transmitted
                bool entering = CosTheta(wo) > 0;
                Float etap = entering ? eta : (1 / eta);

                // Compute ray direction for specular transmission
                Vector3f wi;
                bool tir = !Refract(wo, FaceForward(Normal3f(0, 0, 1), wo), etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (tir)
                    return {};

                SampledSpectrum ft(T / AbsCosTheta(wi));
                // Account for non-symmetry with transmission to different medium
                if (mode == TransportMode::Radiance)
                    ft /= Sqr(etap);

                return BSDFSample(ft, wi, pt / (pr + pt),
                                  BxDFFlags::SpecularTransmission);
            }

        } else {
            // Sample non-delta dielectric interface
            // Sample half-angle vector for outgoing direction and compute Frensel factor
            Vector3f wh = mfDistrib.Sample_wm(wo, u);
            Float F = FrDielectric(
                Dot(Reflect(wo, wh), FaceForward(wh, Vector3f(0, 0, 1))), eta);
            Float R = F, T = 1 - R;

            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample reflection at non-delta dielectric interface
                Vector3f wi = Reflect(wo, wh);
                CHECK_RARE(1e-6, Dot(wo, wh) <= 0);
                if (!SameHemisphere(wo, wi) || Dot(wo, wh) <= 0)
                    return {};

                // Compute PDF of _wi_ for microfacet reflection
                Float pdf = mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);
                CHECK(!IsNaN(pdf));

                // TODO: reuse fragments from f()
                Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
                // Handle degenerate cases for microfacet reflection
                if (cosTheta_i == 0 || cosTheta_o == 0)
                    return {};
                SampledSpectrum f(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                  (4 * cosTheta_i * cosTheta_o));
                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

            } else {
                // Sample transmission at non-delta dielectric interface
                // FIXME (make consistent): this etap is 1/etap as used in
                // specular...
                Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
                Vector3f wi;
                bool tir = !Refract(wo, (Normal3f)wh, etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (SameHemisphere(wo, wi))
                    return {};
                if (tir || wi.z == 0)
                    return {};

                // Evaluate BSDF
                // TODO: share fragments with f(), PDF()...
                wh = FaceForward(wh, Normal3f(0, 0, 1));

                Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
                Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;

                SampledSpectrum f(
                    (1 - F) * factor *
                    std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * AbsDot(wi, wh) *
                             AbsDot(wo, wh) /
                             (AbsCosTheta(wi) * AbsCosTheta(wo) * Sqr(sqrtDenom))));

                // Compute PDF
                Float dwh_dwi =
                    /*Sqr(etap) * */ AbsDot(wi, wh) /
                    Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
                Float pdf = mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
                CHECK(!IsNaN(pdf));

                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyTransmission);
            }
        }
    }